

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::CPY(m6502 *this)

{
  byte bVar1;
  uint16_t tmp;
  m6502 *this_local;
  
  fetch(this);
  bVar1 = this->y - this->fetched;
  SetFlag(this,C,this->fetched <= this->y);
  SetFlag(this,Z,bVar1 == 0);
  SetFlag(this,N,(bVar1 & 0x80) != 0);
  return '\0';
}

Assistant:

uint8_t CPY()
  {
    fetch();
    uint16_t tmp = (uint16_t)y - (uint16_t)fetched;
    SetFlag(C, y >= fetched);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    return 0;
  }